

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::EndGroup(void)

{
  ImVector<ImGuiGroupData> *pIVar1;
  ImVec2 IVar2;
  ImGuiWindow *pIVar3;
  ImGuiGroupData *pIVar4;
  ImGuiContext *pIVar5;
  ImGuiID IVar6;
  long lVar7;
  ImGuiContext *g;
  uint uVar8;
  uint uVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  ImRect local_30;
  ImVec2 local_20;
  
  pIVar5 = GImGui;
  pIVar3 = GImGui->CurrentWindow;
  pIVar3->WriteAccessed = true;
  pIVar4 = (pIVar3->DC).GroupStack.Data;
  lVar7 = (long)(pIVar3->DC).GroupStack.Size;
  local_30.Min = pIVar4[lVar7 + -1].BackupCursorPos;
  IVar2 = (pIVar3->DC).CursorMaxPos;
  fVar10 = IVar2.x;
  fVar11 = IVar2.y;
  fVar12 = local_30.Min.x;
  fVar13 = local_30.Min.y;
  local_30.Max = (ImVec2)(CONCAT44(~-(uint)(fVar11 <= fVar13) & (uint)fVar11,
                                   ~-(uint)(fVar10 <= fVar12) & (uint)fVar10) |
                         CONCAT44((uint)fVar13 & -(uint)(fVar11 <= fVar13),
                                  (uint)fVar12 & -(uint)(fVar10 <= fVar12)));
  (pIVar3->DC).CursorPos = local_30.Min;
  fVar14 = pIVar4[lVar7 + -1].BackupCursorMaxPos.x;
  fVar15 = pIVar4[lVar7 + -1].BackupCursorMaxPos.y;
  uVar8 = -(uint)(fVar10 <= fVar14);
  uVar9 = -(uint)(fVar11 <= fVar15);
  (pIVar3->DC).CursorMaxPos =
       (ImVec2)(CONCAT44(~uVar9 & (uint)fVar11,~uVar8 & (uint)fVar10) |
               CONCAT44((uint)fVar15 & uVar9,(uint)fVar14 & uVar8));
  (pIVar3->DC).Indent.x = pIVar4[lVar7 + -1].BackupIndent.x;
  (pIVar3->DC).GroupOffset.x = pIVar4[lVar7 + -1].BackupGroupOffset.x;
  (pIVar3->DC).CurrentLineSize = pIVar4[lVar7 + -1].BackupCurrentLineSize;
  fVar10 = pIVar4[lVar7 + -1].BackupCurrentLineTextBaseOffset;
  (pIVar3->DC).CurrentLineTextBaseOffset = fVar10;
  (pIVar3->DC).LogLinePosY = fVar13 + -9999.0;
  if (pIVar4[lVar7 + -1].AdvanceCursor == true) {
    fVar11 = (pIVar3->DC).PrevLineTextBaseOffset;
    uVar8 = -(uint)(fVar10 <= fVar11);
    (pIVar3->DC).CurrentLineTextBaseOffset = (float)(~uVar8 & (uint)fVar10 | (uint)fVar11 & uVar8);
    local_20.x = local_30.Max.x - fVar12;
    local_20.y = local_30.Max.y - fVar13;
    ItemSize(&local_20,fVar10);
    ItemAdd(&local_30,0,(ImRect *)0x0);
  }
  IVar6 = pIVar5->ActiveId;
  if (((pIVar4[lVar7 + -1].BackupActiveIdIsAlive == IVar6) || (IVar6 == 0)) ||
     (pIVar5->ActiveIdIsAlive != IVar6)) {
    if ((pIVar4[lVar7 + -1].BackupActiveIdPreviousFrameIsAlive != false) ||
       (pIVar5->ActiveIdPreviousFrameIsAlive != true)) goto LAB_001247b7;
    IVar6 = pIVar5->ActiveIdPreviousFrame;
  }
  (pIVar3->DC).LastItemId = IVar6;
LAB_001247b7:
  (pIVar3->DC).LastItemRect.Min = local_30.Min;
  (pIVar3->DC).LastItemRect.Max = local_30.Max;
  pIVar1 = &(pIVar3->DC).GroupStack;
  pIVar1->Size = pIVar1->Size + -1;
  return;
}

Assistant:

void ImGui::EndGroup()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();
    IM_ASSERT(!window->DC.GroupStack.empty());    // Mismatched BeginGroup()/EndGroup() calls

    ImGuiGroupData& group_data = window->DC.GroupStack.back();

    ImRect group_bb(group_data.BackupCursorPos, window->DC.CursorMaxPos);
    group_bb.Max = ImMax(group_bb.Min, group_bb.Max);

    window->DC.CursorPos = group_data.BackupCursorPos;
    window->DC.CursorMaxPos = ImMax(group_data.BackupCursorMaxPos, window->DC.CursorMaxPos);
    window->DC.Indent = group_data.BackupIndent;
    window->DC.GroupOffset = group_data.BackupGroupOffset;
    window->DC.CurrentLineSize = group_data.BackupCurrentLineSize;
    window->DC.CurrentLineTextBaseOffset = group_data.BackupCurrentLineTextBaseOffset;
    window->DC.LogLinePosY = window->DC.CursorPos.y - 9999.0f; // To enforce Log carriage return

    if (group_data.AdvanceCursor)
    {
        window->DC.CurrentLineTextBaseOffset = ImMax(window->DC.PrevLineTextBaseOffset, group_data.BackupCurrentLineTextBaseOffset);      // FIXME: Incorrect, we should grab the base offset from the *first line* of the group but it is hard to obtain now.
        ItemSize(group_bb.GetSize(), group_data.BackupCurrentLineTextBaseOffset);
        ItemAdd(group_bb, 0);
    }

    // If the current ActiveId was declared within the boundary of our group, we copy it to LastItemId so IsItemActive(), IsItemDeactivated() etc. will be functional on the entire group.
    // It would be be neater if we replaced window.DC.LastItemId by e.g. 'bool LastItemIsActive', but would put a little more burden on individual widgets.
    // (and if you grep for LastItemId you'll notice it is only used in that context.
    if ((group_data.BackupActiveIdIsAlive != g.ActiveId) && (g.ActiveIdIsAlive == g.ActiveId) && g.ActiveId) // && g.ActiveIdWindow->RootWindow == window->RootWindow)
        window->DC.LastItemId = g.ActiveId;
    else if (!group_data.BackupActiveIdPreviousFrameIsAlive && g.ActiveIdPreviousFrameIsAlive) // && g.ActiveIdPreviousFrameWindow->RootWindow == window->RootWindow)
        window->DC.LastItemId = g.ActiveIdPreviousFrame;
    window->DC.LastItemRect = group_bb;

    window->DC.GroupStack.pop_back();

    //window->DrawList->AddRect(group_bb.Min, group_bb.Max, IM_COL32(255,0,255,255));   // [Debug]
}